

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_BrepFace::IsValid(ON_BrepFace *this,ON_TextLog *text_log)

{
  char *pcVar1;
  
  if (this->m_face_index < 0) {
    if (text_log != (ON_TextLog *)0x0) {
      pcVar1 = "ON_BrepFace m_face_index = %d.  Should be >= 0.\n";
LAB_003eb160:
      ON_TextLog::Print(text_log,pcVar1);
      return false;
    }
  }
  else if ((this->m_li).m_count < 1) {
    if (text_log != (ON_TextLog *)0x0) {
      pcVar1 = "ON_BrepFace m_li.Count() = 0  Should be > 0.\n";
LAB_003eb143:
      ON_TextLog::Print(text_log,pcVar1);
      return false;
    }
  }
  else if (this->m_si < 0) {
    if (text_log != (ON_TextLog *)0x0) {
      pcVar1 = "ON_BrepFace m_si = %d.  Should be >= 0.\n";
      goto LAB_003eb160;
    }
  }
  else {
    if (this->m_brep != (ON_Brep *)0x0) {
      return true;
    }
    if (text_log != (ON_TextLog *)0x0) {
      pcVar1 = "ON_BrepFace m_brep = 0.  Should point to parent brep.\n";
      goto LAB_003eb143;
    }
  }
  return false;
}

Assistant:

bool ON_BrepFace::IsValid( ON_TextLog* text_log ) const
{
  if ( m_face_index < 0 )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_face_index = %d.  Should be >= 0.\n",m_face_index);
    return false;
  }

  if ( m_li.Count() < 1 )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_li.Count() = 0  Should be > 0.\n");
    return false;
  }

  if ( m_si < 0 )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_si = %d.  Should be >= 0.\n",m_si);
    return false;
  }

  if ( 0 == m_brep )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_brep = 0.  Should point to parent brep.\n");
    return false;

  }

  return true;
}